

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

void uv_walk(uv_loop_t *loop,uv_walk_cb walk_cb,void *arg)

{
  void **ppvVar1;
  long *plVar2;
  long *plVar3;
  undefined8 *puVar4;
  void **ppvVar5;
  long *local_38;
  void *local_30;
  
  local_38 = (long *)&local_38;
  ppvVar1 = loop->handle_queue;
  plVar2 = (long *)loop->handle_queue[0];
  if (ppvVar1 == (void **)plVar2) {
    ppvVar5 = &local_30;
  }
  else {
    local_30 = loop->handle_queue[1];
    *(long ***)local_30 = &local_38;
    plVar3 = (long *)plVar2[1];
    ppvVar5 = (void **)(plVar2 + 1);
    loop->handle_queue[1] = plVar3;
    *plVar3 = (long)ppvVar1;
    local_38 = plVar2;
  }
  *ppvVar5 = &local_38;
  while (&local_38 != (long **)local_38) {
    *(long *)local_38[1] = *local_38;
    *(long *)(*local_38 + 8) = local_38[1];
    *local_38 = (long)ppvVar1;
    puVar4 = (undefined8 *)loop->handle_queue[1];
    local_38[1] = (long)puVar4;
    *puVar4 = local_38;
    loop->handle_queue[1] = local_38;
    if ((*(byte *)(local_38 + 7) & 0x10) == 0) {
      (*walk_cb)((uv_handle_t *)(local_38 + -4),arg);
    }
  }
  return;
}

Assistant:

void uv_walk(uv_loop_t* loop, uv_walk_cb walk_cb, void* arg) {
  QUEUE queue;
  QUEUE* q;
  uv_handle_t* h;

  QUEUE_MOVE(&loop->handle_queue, &queue);
  while (!QUEUE_EMPTY(&queue)) {
    q = QUEUE_HEAD(&queue);
    h = QUEUE_DATA(q, uv_handle_t, handle_queue);

    QUEUE_REMOVE(q);
    QUEUE_INSERT_TAIL(&loop->handle_queue, q);

    if (h->flags & UV_HANDLE_INTERNAL) continue;
    walk_cb(h, arg);
  }
}